

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

bool __thiscall httplib::Request::is_multipart_form_data(Request *this)

{
  long lVar1;
  allocator local_59;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_58,"Content-Type",&local_59);
  get_header_value(&local_38,this,&local_58,0);
  std::__cxx11::string::~string((string *)&local_58);
  lVar1 = std::__cxx11::string::rfind((char *)&local_38,0x157f5c);
  std::__cxx11::string::~string((string *)&local_38);
  return lVar1 == 0;
}

Assistant:

inline bool Request::is_multipart_form_data() const {
  const auto &content_type = get_header_value("Content-Type");
  return !content_type.rfind("multipart/form-data", 0);
}